

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool duckdb::MultiplyPropagateStatistics::Operation<long,duckdb::TryDecimalMultiply>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  long value;
  long value_00;
  Value local_70;
  long lVar10;
  
  value = 0x7fffffffffffffff;
  lVar3 = NumericStats::GetMin<long>(lstats);
  lVar4 = NumericStats::GetMax<long>(lstats);
  lVar5 = NumericStats::GetMin<long>(rstats);
  lVar6 = NumericStats::GetMax<long>(rstats);
  value_00 = -0x8000000000000000;
  bVar2 = true;
  do {
    bVar7 = bVar2;
    lVar10 = lVar5;
    bVar2 = true;
    do {
      bVar8 = bVar2;
      lVar9 = lVar10 * lVar3;
      bVar1 = lVar9 + 0xf21f494c589c0000U < 0xe43e9298b1380001 ||
              SEXT816(lVar9) != SEXT816(lVar10) * SEXT816(lVar3);
      if (bVar1) {
        return bVar1;
      }
      if (lVar9 < value) {
        value = lVar9;
      }
      if (lVar9 - value_00 != 0 && value_00 <= lVar9) {
        value_00 = lVar9;
      }
      lVar10 = lVar6;
      bVar2 = false;
    } while (bVar8);
    lVar3 = lVar4;
    bVar2 = false;
  } while (bVar7);
  Value::Numeric(&local_70,type,value);
  Value::operator=(new_min,&local_70);
  Value::~Value(&local_70);
  Value::Numeric(&local_70,type,value_00);
  Value::operator=(new_max,&local_70);
  Value::~Value(&local_70);
  return bVar1;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		// statistics propagation on the multiplication is slightly less straightforward because of negative numbers
		// the new min/max depend on the signs of the input types
		// if both are positive the result is [lmin * rmin][lmax * rmax]
		// if lmin/lmax are negative the result is [lmin * rmax][lmax * rmin]
		// etc
		// rather than doing all this switcheroo we just multiply all combinations of lmin/lmax with rmin/rmax
		// and check what the minimum/maximum value is
		T lvals[] {NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(lstats)};
		T rvals[] {NumericStats::GetMin<T>(rstats), NumericStats::GetMax<T>(rstats)};
		T min = NumericLimits<T>::Maximum();
		T max = NumericLimits<T>::Minimum();
		// multiplications
		for (idx_t l = 0; l < 2; l++) {
			for (idx_t r = 0; r < 2; r++) {
				T result;
				if (!OP::Operation(lvals[l], rvals[r], result)) {
					// potential overflow
					return true;
				}
				if (result < min) {
					min = result;
				}
				if (result > max) {
					max = result;
				}
			}
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}